

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_restr * lys_restr_dup(lys_module *mod,lys_restr *old,int size,unres_schema *unres)

{
  LY_ERR *pLVar1;
  ly_ctx *plVar2;
  char *pcVar3;
  int local_3c;
  int i;
  lys_restr *result;
  unres_schema *unres_local;
  int size_local;
  lys_restr *old_local;
  lys_module *mod_local;
  
  if (size == 0) {
    mod_local = (lys_module *)0x0;
  }
  else {
    mod_local = (lys_module *)calloc((long)size,0x38);
    if (mod_local == (lys_module *)0x0) {
      pLVar1 = ly_errno_location();
      *pLVar1 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_restr_dup");
      mod_local = (lys_module *)0x0;
    }
    else {
      for (local_3c = 0; local_3c < size; local_3c = local_3c + 1) {
        *(uint8_t *)(&mod_local->contact + (long)local_3c * 7) = old[local_3c].ext_size;
        lys_ext_dup(mod,old[local_3c].ext,old[local_3c].ext_size,
                    &mod_local->ctx + (long)local_3c * 7,LYEXT_PAR_RESTR,
                    (lys_ext_instance ***)(&mod_local->org + (long)local_3c * 7),unres);
        plVar2 = (ly_ctx *)lydict_insert(mod->ctx,old[local_3c].expr,0);
        (&mod_local->ctx)[(long)local_3c * 7] = plVar2;
        pcVar3 = lydict_insert(mod->ctx,old[local_3c].dsc,0);
        (&mod_local->name)[(long)local_3c * 7] = pcVar3;
        pcVar3 = lydict_insert(mod->ctx,old[local_3c].ref,0);
        (&mod_local->prefix)[(long)local_3c * 7] = pcVar3;
        pcVar3 = lydict_insert(mod->ctx,old[local_3c].eapptag,0);
        (&mod_local->dsc)[(long)local_3c * 7] = pcVar3;
        pcVar3 = lydict_insert(mod->ctx,old[local_3c].emsg,0);
        (&mod_local->ref)[(long)local_3c * 7] = pcVar3;
      }
    }
  }
  return (lys_restr *)mod_local;
}

Assistant:

static struct lys_restr *
lys_restr_dup(struct lys_module *mod, struct lys_restr *old, int size, struct unres_schema *unres)
{
    struct lys_restr *result;
    int i;

    if (!size) {
        return NULL;
    }

    result = calloc(size, sizeof *result);
    if (!result) {
        LOGMEM;
        return NULL;
    }
    for (i = 0; i < size; i++) {
        result[i].ext_size = old[i].ext_size;
        lys_ext_dup(mod, old[i].ext, old[i].ext_size, &result[i], LYEXT_PAR_RESTR, &result[i].ext, unres);
        result[i].expr = lydict_insert(mod->ctx, old[i].expr, 0);
        result[i].dsc = lydict_insert(mod->ctx, old[i].dsc, 0);
        result[i].ref = lydict_insert(mod->ctx, old[i].ref, 0);
        result[i].eapptag = lydict_insert(mod->ctx, old[i].eapptag, 0);
        result[i].emsg = lydict_insert(mod->ctx, old[i].emsg, 0);
    }

    return result;
}